

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::useStream(Config *this,string *streamName)

{
  Stream SVar1;
  Stream stream;
  string *streamName_local;
  Config *this_local;
  
  SVar1 = createStream(streamName);
  setStreamBuf(this,SVar1.streamBuf);
  Stream::release(&this->m_stream);
  (this->m_stream).streamBuf = SVar1.streamBuf;
  (this->m_stream).isOwned = SVar1.isOwned;
  return;
}

Assistant:

void useStream( const std::string& streamName ) {
            Stream stream = createStream( streamName );
            setStreamBuf( stream.streamBuf );
            m_stream.release();
            m_stream = stream;
        }